

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O0

void PrintGraph(InstructionRegVmLowerGraphContext *ctx,RegVmLoweredModule *lowModule)

{
  uint uVar1;
  RegVmLoweredFunction **ppRVar2;
  uint local_1c;
  uint i;
  RegVmLoweredModule *lowModule_local;
  InstructionRegVmLowerGraphContext *ctx_local;
  
  ctx->code = lowModule->vmModule->code;
  local_1c = 0;
  while( true ) {
    uVar1 = SmallArray<RegVmLoweredFunction_*,_32U>::size(&lowModule->functions);
    if (uVar1 <= local_1c) break;
    ppRVar2 = SmallArray<RegVmLoweredFunction_*,_32U>::operator[](&lowModule->functions,local_1c);
    PrintFunction(ctx,lowModule,*ppRVar2);
    local_1c = local_1c + 1;
  }
  OutputContext::Flush(ctx->output);
  return;
}

Assistant:

void PrintGraph(InstructionRegVmLowerGraphContext &ctx, RegVmLoweredModule *lowModule)
{
	ctx.code = lowModule->vmModule->code;

	for(unsigned i = 0; i < lowModule->functions.size(); i++)
		PrintFunction(ctx, lowModule, lowModule->functions[i]);

	ctx.output.Flush();
}